

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O0

bool __thiscall soul::AST::FunctionCall::isResolved(FunctionCall *this)

{
  bool bVar1;
  int iVar2;
  Expression *pEVar3;
  byte local_21;
  byte local_11;
  FunctionCall *this_local;
  
  bVar1 = CallOrCastBase::areAllArgumentsResolved(&this->super_CallOrCastBase);
  local_11 = 0;
  if (bVar1) {
    bVar1 = pool_ptr<soul::AST::Expression>::operator==
                      (&this->targetFunction->returnType,(void *)0x0);
    local_21 = 1;
    if (!bVar1) {
      pEVar3 = pool_ptr<soul::AST::Expression>::operator->(&this->targetFunction->returnType);
      iVar2 = (*(pEVar3->super_Statement).super_ASTObject._vptr_ASTObject[3])();
      local_21 = (byte)iVar2;
    }
    local_11 = local_21;
  }
  return (bool)(local_11 & 1);
}

Assistant:

bool isResolved() const override        { return areAllArgumentsResolved() && (targetFunction.returnType == nullptr || targetFunction.returnType->isResolved()); }